

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O0

Word * __thiscall VM::word(VM *this,uint address)

{
  VMException *pVVar1;
  size_type sVar2;
  reference pvVar3;
  allocator local_71;
  string local_70 [35];
  undefined1 local_4d;
  allocator local_39;
  string local_38 [36];
  uint local_14;
  VM *pVStack_10;
  uint address_local;
  VM *this_local;
  
  local_14 = address;
  pVStack_10 = this;
  if ((address & 3) != 0) {
    local_4d = 1;
    pVVar1 = (VMException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"unaligned memory access",&local_39);
    VMException::VMException(pVVar1,(string *)local_38);
    local_4d = 0;
    __cxa_throw(pVVar1,&VMException::typeinfo,VMException::~VMException);
  }
  sVar2 = std::vector<Word,_std::allocator<Word>_>::size(&this->_program);
  if (sVar2 <= address >> 2) {
    pVVar1 = (VMException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"out of program memory access",&local_71);
    VMException::VMException(pVVar1,(string *)local_70);
    __cxa_throw(pVVar1,&VMException::typeinfo,VMException::~VMException);
  }
  pvVar3 = std::vector<Word,_std::allocator<Word>_>::operator[]
                     (&this->_program,(ulong)(local_14 >> 2));
  return pvVar3;
}

Assistant:

Word &VM::word(unsigned address) {
    if(address % 4) {
        throw VMException{"unaligned memory access"};
    }
    if(address / 4 >= _program.size()) {
        throw VMException{"out of program memory access"};
    }
    return _program[address / 4];
}